

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::FreqFlucCorrFunc::validateSelection(FreqFlucCorrFunc *this,SelectionManager *param_1)

{
  bool bVar1;
  StuntDouble *pSVar2;
  SelectionManager *this_00;
  int i;
  MultipoleAdapter ma;
  int local_34;
  MultipoleAdapter local_30;
  
  this_00 = &(this->super_ObjectACF<double>).super_AutoCorrFunc<double>.super_TimeCorrFunc<double>.
             seleMan1_;
  pSVar2 = SelectionManager::beginSelected(this_00,&local_34);
  if (pSVar2 != (StuntDouble *)0x0) {
    do {
      if (pSVar2->objType_ != otRigidBody) {
        local_30.at_ = (AtomType *)pSVar2[1]._vptr_StuntDouble;
        bVar1 = MultipoleAdapter::isDipole(&local_30);
        if (!bVar1) {
          memcpy(&painCave,
                 "FreqFlucCorrFunc::validateSelection Error: selection is not a RigidBody or does\n\tnot have a dipole\n"
                 ,100);
          painCave.isFatal = 1;
          simError();
        }
      }
      pSVar2 = SelectionManager::nextSelected(this_00,&local_34);
    } while (pSVar2 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void FreqFlucCorrFunc::validateSelection(SelectionManager&) {
    StuntDouble* sd;
    int i;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      if (!sd->isRigidBody()) {
        AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
        MultipoleAdapter ma = MultipoleAdapter(at);

        if (!ma.isDipole()) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "FreqFlucCorrFunc::validateSelection Error: selection is not a "
              "RigidBody "
              "or does\n"
              "\tnot have a dipole\n");
          painCave.isFatal = 1;
          simError();
        }
      }
    }
  }